

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall aiMetadata::Get<double>(aiMetadata *this,string *key,double *value)

{
  bool bVar1;
  aiString local_424;
  double *local_20;
  double *value_local;
  string *key_local;
  aiMetadata *this_local;
  
  local_20 = value;
  value_local = (double *)key;
  key_local = (string *)this;
  aiString::aiString(&local_424,key);
  bVar1 = Get<double>(this,&local_424,local_20);
  return bVar1;
}

Assistant:

inline
    bool Get( const std::string& key, T& value ) const {
        return Get(aiString(key), value);
    }